

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O3

bool cmStrToULongLong(char *str,unsigned_long_long *value)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  ulonglong uVar4;
  char *__nptr;
  bool bVar5;
  char *endp;
  char *local_30;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  __nptr = str + -1;
  do {
    bVar1 = __nptr[1];
    __nptr = __nptr + 1;
    iVar2 = isspace((uint)bVar1);
  } while (iVar2 != 0);
  if (bVar1 == 0x2d) {
    bVar5 = false;
  }
  else {
    uVar4 = strtoull(__nptr,&local_30,10);
    *value = uVar4;
    bVar5 = false;
    if ((__nptr != local_30) && (*local_30 == '\0')) {
      bVar5 = *piVar3 == 0;
    }
  }
  return bVar5;
}

Assistant:

bool cmStrToULongLong(const char* str, unsigned long long* value)
{
  errno = 0;
  char* endp;
  while (cmIsSpace(*str)) {
    ++str;
  }
  if (*str == '-') {
    return false;
  }
  *value = strtoull(str, &endp, 10);
  return (*endp == '\0') && (endp != str) && (errno == 0);
}